

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_file.c
# Opt level: O0

int archive_write_open_FILE(archive *a,FILE *f)

{
  undefined8 *client_data;
  write_FILE_data *mine;
  FILE *f_local;
  archive *a_local;
  
  client_data = (undefined8 *)malloc(8);
  if (client_data == (undefined8 *)0x0) {
    archive_set_error(a,0xc,"No memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    *client_data = f;
    a_local._4_4_ =
         archive_write_open2(a,client_data,file_open,file_write,(undefined1 *)0x0,file_free);
  }
  return a_local._4_4_;
}

Assistant:

int
archive_write_open_FILE(struct archive *a, FILE *f)
{
	struct write_FILE_data *mine;

	mine = malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->f = f;
	return (archive_write_open2(a, mine, file_open, file_write,
	    NULL, file_free));
}